

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

string * jsonnet::internal::strip_ws(string *__return_storage_ptr__,string *s,uint margin)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = s->_M_string_length;
  if (uVar2 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    pcVar1 = (s->_M_dataplus)._M_p;
    for (uVar4 = 0;
        (((uVar5 = uVar2, uVar2 != uVar4 && (uVar5 = uVar4, (ulong)(byte)pcVar1[uVar4] < 0x21)) &&
         ((0x100002200U >> ((ulong)(byte)pcVar1[uVar4] & 0x3f) & 1) != 0)) &&
        (uVar5 = (ulong)margin, margin != uVar4)); uVar4 = uVar4 + 1) {
    }
    uVar4 = uVar2;
    if (uVar5 < uVar2) {
      uVar4 = uVar5;
    }
    while (((uVar3 = uVar4, uVar5 < uVar2 && (uVar3 = uVar2, (ulong)(byte)pcVar1[uVar2 - 1] < 0x21))
           && ((0x100002200U >> ((ulong)(byte)pcVar1[uVar2 - 1] & 0x3f) & 1) != 0))) {
      uVar2 = uVar2 - 1;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1 + uVar5,pcVar1 + uVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string strip_ws(const std::string &s, unsigned margin)
{
    if (s.size() == 0)
        return s;  // Avoid underflow below.
    size_t i = 0;
    while (i < s.length() && is_horz_ws(s[i]) && i < margin)
        i++;
    size_t j = s.size();
    while (j > i && is_horz_ws(s[j - 1])) {
        j--;
    }
    return std::string(&s[i], &s[j]);
}